

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

uint AddBaseClassMemberVariables
               (ExpressionContext *ctx,SynBase *syntax,TypeClass *baseClass,TypeClass *newClass)

{
  uint alignment;
  uint uniqueId;
  SynIdentifier *pSVar1;
  Lexeme *allocator;
  ScopeData *pSVar2;
  TypeBase *type;
  TypeStruct *pTVar3;
  bool bVar4;
  uint offset_00;
  VariableData *this;
  MemberHandle *this_00;
  char *in_R8;
  InplaceStr name;
  VariableData *member;
  uint offset;
  undefined1 local_58 [7];
  bool conflict;
  MemberHandle *local_48;
  MemberHandle *el;
  uint skipMembers;
  uint skipBaseMembers;
  TypeClass *newClass_local;
  TypeClass *baseClass_local;
  SynBase *syntax_local;
  ExpressionContext *ctx_local;
  
  el._4_4_ = 0;
  _skipMembers = newClass;
  newClass_local = baseClass;
  baseClass_local = (TypeClass *)syntax;
  syntax_local = (SynBase *)ctx;
  if (baseClass->baseClass != (TypeClass *)0x0) {
    el._4_4_ = AddBaseClassMemberVariables(ctx,syntax,baseClass->baseClass,newClass);
  }
  el._0_4_ = 0;
  local_48 = (newClass_local->super_TypeStruct).members.head;
  do {
    if (local_48 == (MemberHandle *)0x0) {
      pSVar2 = (_skipMembers->super_TypeStruct).typeScope;
      pSVar2->dataSize =
           (ulong)(newClass_local->super_TypeStruct).super_TypeBase.padding + pSVar2->dataSize;
      (_skipMembers->super_TypeStruct).super_TypeBase.size =
           (ulong)(newClass_local->super_TypeStruct).super_TypeBase.padding +
           (_skipMembers->super_TypeStruct).super_TypeBase.size;
      return (uint)el;
    }
    pSVar1 = local_48->variable->name;
    InplaceStr::InplaceStr((InplaceStr *)local_58,"$typeid");
    bVar4 = InplaceStr::operator==(&pSVar1->name,(InplaceStr *)local_58);
    if (!bVar4) {
      el._0_4_ = (uint)el + 1;
      if (el._4_4_ == 0) {
        pSVar1 = local_48->variable->name;
        name.end = in_R8;
        name.begin = (pSVar1->name).end;
        bVar4 = anon_unknown.dwarf_6f1cc::CheckVariableConflict
                          ((anon_unknown_dwarf_6f1cc *)syntax_local,
                           (ExpressionContext *)baseClass_local,(SynBase *)(pSVar1->name).begin,name
                          );
        offset_00 = anon_unknown.dwarf_6f1cc::AllocateVariableInScope
                              ((ExpressionContext *)syntax_local,(SynBase *)baseClass_local,
                               local_48->variable->alignment,local_48->variable->type);
        if (offset_00 != local_48->variable->offset) {
          __assert_fail("offset == el->variable->offset",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x2981,
                        "unsigned int AddBaseClassMemberVariables(ExpressionContext &, SynBase *, TypeClass *, TypeClass *)"
                       );
        }
        this = ExpressionContext::get<VariableData>((ExpressionContext *)syntax_local);
        allocator = syntax_local[0x229].begin;
        pSVar2 = (ScopeData *)syntax_local[0x205].end;
        alignment = local_48->variable->alignment;
        in_R8 = (char *)(ulong)alignment;
        type = local_48->variable->type;
        pSVar1 = local_48->variable->name;
        uniqueId = *(uint *)((long)&syntax_local[0x228].next + 4);
        *(uint *)((long)&syntax_local[0x228].next + 4) = uniqueId + 1;
        VariableData::VariableData
                  (this,(Allocator *)allocator,(SynBase *)baseClass_local,pSVar2,alignment,type,
                   pSVar1,offset_00,uniqueId);
        if (!bVar4) {
          ExpressionContext::AddVariable((ExpressionContext *)syntax_local,this,true);
        }
        pTVar3 = &_skipMembers->super_TypeStruct;
        this_00 = ExpressionContext::get<MemberHandle>((ExpressionContext *)syntax_local);
        MemberHandle::MemberHandle(this_00,local_48->variable->source,this,(SynBase *)0x0);
        IntrusiveList<MemberHandle>::push_back(&pTVar3->members,this_00);
      }
      else {
        el._4_4_ = el._4_4_ - 1;
      }
    }
    local_48 = local_48->next;
  } while( true );
}

Assistant:

unsigned AddBaseClassMemberVariables(ExpressionContext &ctx, SynBase *syntax, TypeClass *baseClass, TypeClass *newClass)
{
	unsigned skipBaseMembers = 0;

	if(baseClass->baseClass)
		skipBaseMembers = AddBaseClassMemberVariables(ctx, syntax, baseClass->baseClass, newClass);

	unsigned skipMembers = 0;

	for(MemberHandle *el = baseClass->members.head; el; el = el->next)
	{
		if(el->variable->name->name == InplaceStr("$typeid"))
			continue;

		skipMembers++;

		if(skipBaseMembers > 0)
		{
			skipBaseMembers--;
			continue;
		}

		bool conflict = CheckVariableConflict(ctx, syntax, el->variable->name->name);

		unsigned offset = AllocateVariableInScope(ctx, syntax, el->variable->alignment, el->variable->type);

		assert(offset == el->variable->offset);

		VariableData *member = new (ctx.get<VariableData>()) VariableData(ctx.allocator, syntax, ctx.scope, el->variable->alignment, el->variable->type, el->variable->name, offset, ctx.uniqueVariableId++);

		if(!conflict)
			ctx.AddVariable(member, true);

		newClass->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(el->variable->source, member, NULL));
	}

	// Add padding from base class
	newClass->typeScope->dataSize += baseClass->padding;
	newClass->size += baseClass->padding;

	return skipMembers;
}